

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<QBoxLayoutItem_*>::data(QList<QBoxLayoutItem_*> *this)

{
  QArrayDataPointer<QBoxLayoutItem_*> *this_00;
  QBoxLayoutItem **ppQVar1;
  QArrayDataPointer<QBoxLayoutItem_*> *in_RDI;
  
  detach((QList<QBoxLayoutItem_*> *)0x2fa4ac);
  this_00 = (QArrayDataPointer<QBoxLayoutItem_*> *)
            QArrayDataPointer<QBoxLayoutItem_*>::operator->(in_RDI);
  ppQVar1 = QArrayDataPointer<QBoxLayoutItem_*>::data(this_00);
  return ppQVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }